

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wcssub.c
# Opt level: O0

int ffgicsa(fitsfile *fptr,char version,double *xrval,double *yrval,double *xrpix,double *yrpix,
           double *xinc,double *yinc,double *rot,char *type,int *status)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  double dVar5;
  double __x;
  double dVar6;
  double dVar7;
  double local_198;
  double local_190;
  double local_178;
  double local_170;
  double toler;
  double temp;
  double phib;
  double phia;
  double pi;
  double pc12;
  double pc22;
  double pc21;
  double pc11;
  double cd12;
  double cd22;
  double cd21;
  double cd11;
  char local_f8 [6];
  char alt [2];
  char keyname [71];
  char local_a8;
  char acStack_a7 [3];
  char acStack_a4 [4];
  char ctype [71];
  int pc_exists;
  int cd_exists;
  int tstat;
  double *yrpix_local;
  double *xrpix_local;
  double *yrval_local;
  double *xrval_local;
  fitsfile *pfStack_20;
  char version_local;
  fitsfile *fptr_local;
  
  pc_exists = 0;
  cd21 = 0.0;
  cd22 = 0.0;
  cd12 = 0.0;
  pc11 = 0.0;
  pc21 = 1.0;
  pc22 = 0.0;
  pc12 = 1.0;
  pi = 0.0;
  if (*status < 1) {
    _cd_exists = yrpix;
    yrpix_local = xrpix;
    xrpix_local = yrval;
    yrval_local = xrval;
    xrval_local._7_1_ = version;
    pfStack_20 = fptr;
    if (version == ' ') {
      ffgics(fptr,xrval,yrval,xrpix,yrpix,xinc,yinc,rot,type,status);
      fptr_local._4_4_ = *status;
    }
    else if ((version < '[') && ('@' < version)) {
      cd11._7_1_ = 0;
      pc_exists = 0;
      cd11._6_1_ = version;
      strcpy(local_f8,"CRVAL1");
      strcat(local_f8,(char *)((long)&cd11 + 6));
      iVar1 = ffgkyd(pfStack_20,local_f8,yrval_local,(char *)0x0,&pc_exists);
      if (iVar1 != 0) {
        *yrval_local = 0.0;
      }
      pc_exists = 0;
      strcpy(local_f8,"CRVAL2");
      strcat(local_f8,(char *)((long)&cd11 + 6));
      iVar1 = ffgkyd(pfStack_20,local_f8,xrpix_local,(char *)0x0,&pc_exists);
      if (iVar1 != 0) {
        *xrpix_local = 0.0;
      }
      pc_exists = 0;
      strcpy(local_f8,"CRPIX1");
      strcat(local_f8,(char *)((long)&cd11 + 6));
      iVar1 = ffgkyd(pfStack_20,local_f8,yrpix_local,(char *)0x0,&pc_exists);
      if (iVar1 != 0) {
        *yrpix_local = 0.0;
      }
      pc_exists = 0;
      strcpy(local_f8,"CRPIX2");
      strcat(local_f8,(char *)((long)&cd11 + 6));
      iVar1 = ffgkyd(pfStack_20,local_f8,_cd_exists,(char *)0x0,&pc_exists);
      if (iVar1 != 0) {
        *_cd_exists = 0.0;
      }
      pc_exists = 0;
      strcpy(local_f8,"CDELT1");
      strcat(local_f8,(char *)((long)&cd11 + 6));
      iVar1 = ffgkyd(pfStack_20,local_f8,xinc,(char *)0x0,&pc_exists);
      if (iVar1 == 0) {
        strcpy(local_f8,"CDELT2");
        strcat(local_f8,(char *)((long)&cd11 + 6));
        iVar1 = ffgkyd(pfStack_20,local_f8,yinc,(char *)0x0,&pc_exists);
        if (iVar1 != 0) {
          *yinc = 1.0;
        }
        pc_exists = 0;
        strcpy(local_f8,"CROTA2");
        strcat(local_f8,(char *)((long)&cd11 + 6));
        iVar1 = ffgkyd(pfStack_20,local_f8,rot,(char *)0x0,&pc_exists);
        if (iVar1 != 0) {
          *rot = 0.0;
          pc_exists = 0;
          strcpy(local_f8,"PC1_1");
          strcat(local_f8,(char *)((long)&cd11 + 6));
          iVar1 = ffgkyd(pfStack_20,local_f8,&pc21,(char *)0x0,&pc_exists);
          if (iVar1 != 0) {
            pc_exists = 0;
          }
          strcpy(local_f8,"PC2_1");
          strcat(local_f8,(char *)((long)&cd11 + 6));
          iVar2 = ffgkyd(pfStack_20,local_f8,&pc22,(char *)0x0,&pc_exists);
          if (iVar2 != 0) {
            pc_exists = 0;
          }
          strcpy(local_f8,"PC1_2");
          strcat(local_f8,(char *)((long)&cd11 + 6));
          iVar3 = ffgkyd(pfStack_20,local_f8,&pi,(char *)0x0,&pc_exists);
          if (iVar3 != 0) {
            pc_exists = 0;
          }
          strcpy(local_f8,"PC2_2");
          strcat(local_f8,(char *)((long)&cd11 + 6));
          iVar4 = ffgkyd(pfStack_20,local_f8,&pc12,(char *)0x0,&pc_exists);
          if (iVar4 != 0) {
            pc_exists = 0;
          }
          if (iVar4 == 0 || (iVar3 == 0 || (iVar2 == 0 || iVar1 == 0))) {
            dVar7 = atan2(pc22,pc21);
            local_198 = atan2(-pi,pc12);
            local_190 = local_198;
            if (dVar7 < local_198) {
              local_190 = dVar7;
            }
            if (local_198 < dVar7) {
              local_198 = dVar7;
            }
            phib = local_190;
            if (1.5707963267948966 < local_198 - local_190) {
              phib = local_190 + 3.141592653589793;
            }
            if (0.0002 < ABS(phib - local_198)) {
              *status = 0x1fa;
            }
            *rot = (((phib + local_198) / 2.0) * 180.0) / 3.141592653589793;
          }
        }
      }
      else {
        pc_exists = 0;
        strcpy(local_f8,"CD1_1");
        strcat(local_f8,(char *)((long)&cd11 + 6));
        iVar1 = ffgkyd(pfStack_20,local_f8,&cd21,(char *)0x0,&pc_exists);
        if (iVar1 != 0) {
          pc_exists = 0;
        }
        strcpy(local_f8,"CD2_1");
        strcat(local_f8,(char *)((long)&cd11 + 6));
        iVar2 = ffgkyd(pfStack_20,local_f8,&cd22,(char *)0x0,&pc_exists);
        if (iVar2 != 0) {
          pc_exists = 0;
        }
        strcpy(local_f8,"CD1_2");
        strcat(local_f8,(char *)((long)&cd11 + 6));
        iVar3 = ffgkyd(pfStack_20,local_f8,&pc11,(char *)0x0,&pc_exists);
        if (iVar3 != 0) {
          pc_exists = 0;
        }
        strcpy(local_f8,"CD2_2");
        strcat(local_f8,(char *)((long)&cd11 + 6));
        iVar4 = ffgkyd(pfStack_20,local_f8,&cd12,(char *)0x0,&pc_exists);
        if (iVar4 != 0) {
          pc_exists = 0;
        }
        if (iVar4 != 0 && (iVar3 != 0 && (iVar2 != 0 && iVar1 != 0))) {
          *xinc = 1.0;
          pc_exists = 0;
          strcpy(local_f8,"CDELT2");
          strcat(local_f8,(char *)((long)&cd11 + 6));
          iVar1 = ffgkyd(pfStack_20,local_f8,yinc,(char *)0x0,&pc_exists);
          if (iVar1 != 0) {
            *yinc = 1.0;
          }
          pc_exists = 0;
          strcpy(local_f8,"CROTA2");
          strcat(local_f8,(char *)((long)&cd11 + 6));
          iVar1 = ffgkyd(pfStack_20,local_f8,rot,(char *)0x0,&pc_exists);
          if (iVar1 != 0) {
            *rot = 0.0;
          }
        }
        else {
          dVar5 = atan2(cd22,cd21);
          local_178 = atan2(-pc11,cd12);
          dVar7 = cd21;
          local_170 = local_178;
          if (dVar5 < local_178) {
            local_170 = dVar5;
          }
          if (local_178 < dVar5) {
            local_178 = dVar5;
          }
          phib = local_170;
          if (1.5707963267948966 < local_178 - local_170) {
            phib = local_170 + 3.141592653589793;
          }
          if (0.0002 < ABS(phib - local_178)) {
            *status = 0x1fa;
          }
          __x = (phib + local_178) / 2.0;
          dVar6 = cos(__x);
          dVar5 = cd12;
          *xinc = dVar7 / dVar6;
          dVar7 = cos(__x);
          *yinc = dVar5 / dVar7;
          *rot = (__x * 180.0) / 3.141592653589793;
          if (*yinc <= 0.0 && *yinc != 0.0) {
            *xinc = -*xinc;
            *yinc = -*yinc;
            *rot = *rot - 180.0;
          }
        }
      }
      pc_exists = 0;
      strcpy(local_f8,"CTYPE1");
      strcat(local_f8,(char *)((long)&cd11 + 6));
      iVar1 = ffgkys(pfStack_20,local_f8,&local_a8,(char *)0x0,&pc_exists);
      if (iVar1 == 0) {
        strncpy(type,acStack_a4,4);
        type[4] = '\0';
        iVar1 = strncmp(&local_a8,"DEC-",4);
        if ((iVar1 == 0) || (iVar1 = strncmp(acStack_a7,"LAT",3), iVar1 == 0)) {
          *rot = 90.0 - *rot;
          *yinc = -*yinc;
          dVar7 = *yrval_local;
          *yrval_local = *xrpix_local;
          *xrpix_local = dVar7;
        }
      }
      else {
        *type = '\0';
      }
      fptr_local._4_4_ = *status;
    }
    else {
      ffpmsg("ffgicsa: illegal WCS version code (must be A - Z or blank)");
      *status = 0x1f7;
      fptr_local._4_4_ = 0x1f7;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffgicsa(fitsfile *fptr,    /* I - FITS file pointer           */
           char version,      /* I - character code of desired version */
	                      /*     A - Z or blank */
           double *xrval,     /* O - X reference value           */
           double *yrval,     /* O - Y reference value           */
           double *xrpix,     /* O - X reference pixel           */
           double *yrpix,     /* O - Y reference pixel           */
           double *xinc,      /* O - X increment per pixel       */
           double *yinc,      /* O - Y increment per pixel       */
           double *rot,       /* O - rotation angle (degrees)    */
           char *type,        /* O - type of projection ('-tan') */
           int *status)       /* IO - error status               */
/*
       read the values of the celestial coordinate system keywords.
       These values may be used as input to the subroutines that
       calculate celestial coordinates. (ffxypx, ffwldp)

       Modified in Nov 1999 to convert the CD matrix keywords back
       to the old CDELTn form, and to swap the axes if the dec-like
       axis is given first, and to assume default values if any of the
       keywords are not present.
*/
{
    int tstat = 0, cd_exists = 0, pc_exists = 0;
    char ctype[FLEN_VALUE], keyname[FLEN_VALUE], alt[2];
    double cd11 = 0.0, cd21 = 0.0, cd22 = 0.0, cd12 = 0.0;
    double pc11 = 1.0, pc21 = 0.0, pc22 = 1.0, pc12 = 0.0;
    double pi =  3.1415926535897932;
    double phia, phib, temp;
    double toler = .0002;  /* tolerance for angles to agree (radians) */
                           /*   (= approximately 0.01 degrees) */

    if (*status > 0)
       return(*status);

    if (version == ' ') {
      ffgics(fptr, xrval, yrval, xrpix, yrpix, xinc, yinc, rot, type, status);
      return (*status);
    }

    if (version > 'Z' || version < 'A') {
      ffpmsg("ffgicsa: illegal WCS version code (must be A - Z or blank)");
      return(*status = WCS_ERROR);
    }

    alt[0] = version;
    alt[1] = '\0';
    
    tstat = 0;
    strcpy(keyname, "CRVAL1");
    strcat(keyname, alt);
    if (ffgkyd(fptr, keyname, xrval, NULL, &tstat))
       *xrval = 0.;

    tstat = 0;
    strcpy(keyname, "CRVAL2");
    strcat(keyname, alt);
    if (ffgkyd(fptr, keyname, yrval, NULL, &tstat))
       *yrval = 0.;

    tstat = 0;
    strcpy(keyname, "CRPIX1");
    strcat(keyname, alt);
    if (ffgkyd(fptr, keyname, xrpix, NULL, &tstat))
        *xrpix = 0.;

    tstat = 0;
    strcpy(keyname, "CRPIX2");
    strcat(keyname, alt);
     if (ffgkyd(fptr, keyname, yrpix, NULL, &tstat))
        *yrpix = 0.;

    /* look for CDELTn first, then CDi_j keywords */
    tstat = 0;
    strcpy(keyname, "CDELT1");
    strcat(keyname, alt);
    if (ffgkyd(fptr, keyname, xinc, NULL, &tstat))
    {
        /* CASE 1: no CDELTn keyword, so look for the CD matrix */
        tstat = 0;
        strcpy(keyname, "CD1_1");
        strcat(keyname, alt);
        if (ffgkyd(fptr, keyname, &cd11, NULL, &tstat))
            tstat = 0;  /* reset keyword not found error */
        else
            cd_exists = 1;  /* found at least 1 CD_ keyword */

        strcpy(keyname, "CD2_1");
        strcat(keyname, alt);
        if (ffgkyd(fptr, keyname, &cd21, NULL, &tstat))
            tstat = 0;  /* reset keyword not found error */
        else
            cd_exists = 1;  /* found at least 1 CD_ keyword */

        strcpy(keyname, "CD1_2");
        strcat(keyname, alt);
        if (ffgkyd(fptr, keyname, &cd12, NULL, &tstat))
            tstat = 0;  /* reset keyword not found error */
        else
            cd_exists = 1;  /* found at least 1 CD_ keyword */

        strcpy(keyname, "CD2_2");
        strcat(keyname, alt);
        if (ffgkyd(fptr, keyname, &cd22, NULL, &tstat))
            tstat = 0;  /* reset keyword not found error */
        else
            cd_exists = 1;  /* found at least 1 CD_ keyword */

        if (cd_exists)  /* convert CDi_j back to CDELTn */
        {
            /* there are 2 ways to compute the angle: */
            phia = atan2( cd21, cd11);
            phib = atan2(-cd12, cd22);

            /* ensure that phia <= phib */
            temp = minvalue(phia, phib);
            phib = maxvalue(phia, phib);
            phia = temp;

            /* there is a possible 180 degree ambiguity in the angles */
            /* so add 180 degress to the smaller value if the values  */
            /* differ by more than 90 degrees = pi/2 radians.         */
            /* (Later, we may decide to take the other solution by    */
            /* subtracting 180 degrees from the larger value).        */

            if ((phib - phia) > (pi / 2.))
               phia += pi;

            if (fabs(phia - phib) > toler) 
            {
               /* angles don't agree, so looks like there is some skewness */
               /* between the axes.  Return with an error to be safe. */
               *status = APPROX_WCS_KEY;
            }
      
            phia = (phia + phib) /2.;  /* use the average of the 2 values */
            *xinc = cd11 / cos(phia);
            *yinc = cd22 / cos(phia);
            *rot = phia * 180. / pi;

            /* common usage is to have a positive yinc value.  If it is */
            /* negative, then subtract 180 degrees from rot and negate  */
            /* both xinc and yinc.  */

            if (*yinc < 0)
            {
                *xinc = -(*xinc);
                *yinc = -(*yinc);
                *rot = *rot - 180.;
            }
        }
        else   /* no CD matrix keywords either */
        {
            *xinc = 1.;

            /* there was no CDELT1 keyword, but check for CDELT2 just in case */
            tstat = 0;
            strcpy(keyname, "CDELT2");
            strcat(keyname, alt);
            if (ffgkyd(fptr, keyname, yinc, NULL, &tstat))
                *yinc = 1.;

            tstat = 0;
            strcpy(keyname, "CROTA2");
            strcat(keyname, alt);
            if (ffgkyd(fptr, keyname, rot, NULL, &tstat))
                *rot=0.;
        }
    }
    else  /* Case 2: CDELTn + optional PC matrix */
    {
        strcpy(keyname, "CDELT2");
        strcat(keyname, alt);
        if (ffgkyd(fptr, keyname, yinc, NULL, &tstat))
            *yinc = 1.;

        tstat = 0;
        strcpy(keyname, "CROTA2");
        strcat(keyname, alt);
        if (ffgkyd(fptr, keyname, rot, NULL, &tstat))
        {
            *rot=0.;

            /* no CROTA2 keyword, so look for the PC matrix */
            tstat = 0;
            strcpy(keyname, "PC1_1");
            strcat(keyname, alt);
            if (ffgkyd(fptr, keyname, &pc11, NULL, &tstat))
                tstat = 0;  /* reset keyword not found error */
            else
                pc_exists = 1;  /* found at least 1 PC_ keyword */

            strcpy(keyname, "PC2_1");
            strcat(keyname, alt);
            if (ffgkyd(fptr, keyname, &pc21, NULL, &tstat))
                tstat = 0;  /* reset keyword not found error */
            else
                pc_exists = 1;  /* found at least 1 PC_ keyword */

            strcpy(keyname, "PC1_2");
            strcat(keyname, alt);
            if (ffgkyd(fptr, keyname, &pc12, NULL, &tstat))
                tstat = 0;  /* reset keyword not found error */
            else
                pc_exists = 1;  /* found at least 1 PC_ keyword */

            strcpy(keyname, "PC2_2");
            strcat(keyname, alt);
            if (ffgkyd(fptr, keyname, &pc22, NULL, &tstat))
                tstat = 0;  /* reset keyword not found error */
            else
                pc_exists = 1;  /* found at least 1 PC_ keyword */

            if (pc_exists)  /* convert PCi_j back to CDELTn */
            {
                /* there are 2 ways to compute the angle: */
                phia = atan2( pc21, pc11);
                phib = atan2(-pc12, pc22);

                /* ensure that phia <= phib */
                temp = minvalue(phia, phib);
                phib = maxvalue(phia, phib);
                phia = temp;

                /* there is a possible 180 degree ambiguity in the angles */
                /* so add 180 degress to the smaller value if the values  */
                /* differ by more than 90 degrees = pi/2 radians.         */
                /* (Later, we may decide to take the other solution by    */
                /* subtracting 180 degrees from the larger value).        */

                if ((phib - phia) > (pi / 2.))
                   phia += pi;

                if (fabs(phia - phib) > toler) 
                {
                  /* angles don't agree, so looks like there is some skewness */
                  /* between the axes.  Return with an error to be safe. */
                  *status = APPROX_WCS_KEY;
                }
      
                phia = (phia + phib) /2.;  /* use the average of the 2 values */
                *rot = phia * 180. / pi;
            }
        }
    }

    /* get the type of projection, if any */
    tstat = 0;
    strcpy(keyname, "CTYPE1");
    strcat(keyname, alt);
    if (ffgkys(fptr, keyname, ctype, NULL, &tstat))
         type[0] = '\0';
    else
    {
        /* copy the projection type string */
        strncpy(type, &ctype[4], 4);
        type[4] = '\0';

        /* check if RA and DEC are inverted */
        if (!strncmp(ctype, "DEC-", 4) || !strncmp(ctype+1, "LAT", 3))
        {
            /* the latitudinal axis is given first, so swap them */

            *rot = 90. - (*rot);

            /* Empirical tests with ds9 show the y-axis sign must be negated */
            /* and the xinc and yinc values must NOT be swapped. */
            *yinc = -(*yinc);

            temp = *xrval;
            *xrval = *yrval;
            *yrval = temp;
        }   
    }

    return(*status);
}